

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokenizer::enum_defines(CTcTokenizer *this,_func_void_void_ptr_CTcHashEntryPp_ptr *cb,void *ctx)

{
  def_enum_cb_t myctx;
  _func_void_void_ptr_CTcHashEntryPp_ptr *local_10;
  void *local_8;
  
  local_10 = cb;
  local_8 = ctx;
  (*this->defines_->_vptr_CTcMacroTable[5])(this->defines_,enum_defines_cb,&local_10);
  return;
}

Assistant:

void CTcTokenizer::enum_defines(void (*cb)(void *, CTcHashEntryPp *),
                                void *ctx)
{
    def_enum_cb_t myctx;

    /* set up our impedence-matcher context with the real callback info */
    myctx.cb = cb;
    myctx.ctx = ctx;

    /* enumerate through our impedence-matcher callback */
    defines_->enum_entries(&enum_defines_cb, &myctx);
}